

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_4::checkOpenEXRFile(char *fileName,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  Header *pHVar10;
  ulong uVar11;
  undefined7 in_register_00000009;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  exr_context_t f;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  MultiPartInputFile multi;
  exr_context_t local_d0;
  size_t local_c8;
  _priv_exr_context_t local_c0;
  undefined7 uStack_bf;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  if ((int)CONCAT71(in_register_00000009,runCoreCheck) != 0) {
    local_50 = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_90 = 0;
    p_Stack_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = 0;
    local_a0 = 0x68;
    uStack_48 = 0xbf800000fffffffe;
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_unknown_0::core_error_handler_cb
    ;
    if (reduceMemory || reduceTime) {
      uStack_58 = 0x80000000800;
      local_50 = 0x20000000200;
    }
    iVar7 = exr_start_read(&local_d0,fileName,&local_a0);
    if (iVar7 != 0) {
      return true;
    }
    bVar3 = anon_unknown_0::checkCoreFile(local_d0,reduceMemory,reduceTime);
    exr_finish(&local_d0);
    return bVar3;
  }
  local_38 = Imf_3_4::CompositeDeepScanLine::getMaximumSampleCount();
  Imf_3_4::Header::getMaxImageSize(&local_a4,&local_a8);
  Imf_3_4::Header::getMaxImageSize(&local_ac,&local_b0);
  if (reduceMemory || reduceTime) {
    Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
    Imf_3_4::Header::setMaxImageSize(0x800,0x800);
    iVar8 = 0x200;
    iVar7 = 0x200;
  }
  else {
    iVar8 = 0x4000;
    iVar7 = 0x4000;
  }
  Imf_3_4::Header::setMaxTileSize(iVar8,iVar7);
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = (_priv_exr_context_t)0x0;
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_a0,fileName,iVar7,true);
  Imf_3_4::MultiPartInputFile::header((int)&local_a0);
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&local_d0);
  cVar4 = Imf_3_4::isTiled((string *)&local_d0);
  if (cVar4 == '\0') {
    bVar3 = false;
  }
  else {
    Imf_3_4::MultiPartInputFile::header((int)&local_a0);
    puVar9 = (uint *)Imf_3_4::Header::tileDescription();
    uVar1 = *puVar9;
    uVar2 = puVar9[1];
    pHVar10 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&local_a0);
    iVar7 = Imf_3_4::calculateBytesPerPixel(pHVar10);
    if ((local_c8 == DAT_0012aa60) &&
       ((local_c8 == 0 || (iVar8 = bcmp(local_d0,DEEPTILE_abi_cxx11_,local_c8), iVar8 == 0)))) {
      uVar11 = 4;
      if (4 < (ulong)(long)iVar7) {
        uVar11 = (long)iVar7;
      }
    }
    else {
      uVar11 = (long)iVar7;
    }
    bVar3 = 1000000 < (ulong)uVar2 * (ulong)uVar1 * uVar11;
  }
  bVar5 = anon_unknown_0::readMultiPart((MultiPartInputFile *)&local_a0,reduceMemory,reduceTime);
  if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_00110fb7;
  }
  else {
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_a0,fileName,iVar7);
    bVar6 = anon_unknown_0::readRgba((RgbaInputFile *)&local_a0,reduceTime,reduceTime_00);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_a0);
    if ((bVar6) &&
       ((local_c8 != DAT_0012aa60 ||
        ((local_c8 != 0 && (iVar7 = bcmp(local_d0,DEEPTILE_abi_cxx11_,local_c8), iVar7 != 0)))))) {
      bVar5 = true;
    }
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&local_a0,fileName,iVar7);
    bVar6 = anon_unknown_0::readScanline<Imf_3_4::InputFile>
                      ((InputFile *)&local_a0,reduceTime,reduceTime_01);
    if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if ((bVar6) &&
       ((local_c8 != DAT_0012aa60 ||
        ((local_c8 != 0 && (iVar7 = bcmp(local_d0,DEEPTILE_abi_cxx11_,local_c8), iVar7 != 0)))))) {
      bVar5 = true;
    }
  }
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_a0,fileName,iVar7);
  bVar6 = anon_unknown_0::readTile<Imf_3_4::TiledInputFile>
                    ((TiledInputFile *)&local_a0,reduceMemory,reduceTime);
  if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (((bVar6) && (local_c8 == DAT_0012aa20)) &&
     ((local_c8 == 0 || (iVar7 = bcmp(local_d0,TILEDIMAGE_abi_cxx11_,local_c8), iVar7 == 0)))) {
    bVar5 = true;
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_00110fb7;
  }
  else {
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&local_a0,fileName,iVar7);
    bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_4::DeepScanLineInputFile>
                      ((DeepScanLineInputFile *)&local_a0,reduceTime,reduceTime_02);
    if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (((bVar3) && (local_c8 == DAT_0012aa40)) &&
       ((local_c8 == 0 || (iVar7 = bcmp(local_d0,DEEPSCANLINE_abi_cxx11_,local_c8), iVar7 == 0)))) {
      bVar5 = true;
    }
  }
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)&local_a0,fileName,iVar7);
  bVar3 = anon_unknown_0::readDeepTile<Imf_3_4::DeepTiledInputFile>
                    ((DeepTiledInputFile *)&local_a0,reduceMemory,reduceTime);
  if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (((bVar3) && (local_c8 == DAT_0012aa60)) &&
     ((local_c8 == 0 || (iVar7 = bcmp(local_d0,DEEPTILE_abi_cxx11_,local_c8), iVar7 == 0)))) {
    bVar5 = true;
  }
LAB_00110fb7:
  Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(local_38);
  Imf_3_4::Header::setMaxImageSize(local_a4,local_a8);
  Imf_3_4::Header::setMaxTileSize(local_ac,local_b0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return bVar5;
}

Assistant:

bool
checkOpenEXRFile (
    const char* fileName, bool reduceMemory, bool reduceTime, bool runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (fileName, reduceMemory, reduceTime);
    }
    else { return runChecks (fileName, reduceMemory, reduceTime); }
}